

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.hpp
# Opt level: O1

double __thiscall Instance::objval(Instance *this,QpVector *x)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  QpVector local_50;
  
  lVar3 = (long)(this->c).num_nz;
  dVar6 = 0.0;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      iVar2 = (this->c).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar4];
      dVar6 = dVar6 + (this->c).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar2] *
                      (x->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar2];
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  MatrixBase::vec_mat(&local_50,&(this->Q).mat,x);
  dVar5 = 0.0;
  if (0 < (long)local_50.num_nz) {
    lVar3 = 0;
    do {
      dVar5 = dVar5 + local_50.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [local_50.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar3]] *
                      (x->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [local_50.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar3]];
      lVar3 = lVar3 + 1;
    } while (local_50.num_nz != lVar3);
  }
  dVar1 = this->offset;
  if (local_50.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_50.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return dVar5 * 0.5 + dVar6 + dVar1;
}

Assistant:

double objval(const QpVector& x) {
    return c * x + 0.5 * (Q.vec_mat(x) * x) + offset;
  }